

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O2

RC __thiscall RM_FileHandle::GetRec(RM_FileHandle *this,RID *rid,RM_Record *rec)

{
  int rec_size;
  RC RVar1;
  RC RVar2;
  PageNum page;
  SlotNum slot;
  RID local_58;
  char *bitmap;
  PF_PageHandle ph;
  RM_PageHeader *pageheader;
  
  if (this->openedFH == true) {
    RVar1 = GetPageNumAndSlot(this,rid,&page,&slot);
    if (RVar1 == 0) {
      PF_PageHandle::PF_PageHandle(&ph);
      RVar1 = PF_FileHandle::GetThisPage(&this->pfh,page,&ph);
      if (RVar1 == 0) {
        RVar1 = GetPageDataAndBitmap(this,&ph,&bitmap,&pageheader);
        if (RVar1 == 0) {
          if ((this->header).numRecordsPerPage < slot) {
            RVar1 = 0x68;
          }
          else if (((uint)(int)bitmap[slot / 8] >> (slot % 8 & 0x1fU) & 1) == 0) {
            RVar1 = 0x67;
          }
          else {
            local_58 = *rid;
            rec_size = (this->header).recordSize;
            RVar1 = RM_Record::SetRecord
                              (rec,&local_58,
                               bitmap + (long)(slot * rec_size) + (long)(this->header).bitmapSize,
                               rec_size);
            RID::~RID(&local_58);
          }
        }
        RVar2 = PF_FileHandle::UnpinPage(&this->pfh,page);
        if (RVar2 != 0) {
          RVar1 = RVar2;
        }
      }
      PF_PageHandle::~PF_PageHandle(&ph);
    }
  }
  else {
    RVar1 = 0x6a;
  }
  return RVar1;
}

Assistant:

RC RM_FileHandle::GetRec (const RID &rid, RM_Record &rec) const {
  // only proceed if this filehandle is associated with an open file
  if (!isValidFH())
    return (RM_INVALIDFILE);

  // Retrieves page and slot number from RID
  RC rc = 0;
  PageNum page;
  SlotNum slot;
  if((rc = GetPageNumAndSlot(rid, page, slot)))
    return (rc);

  // Retrieves the appropriate page, and its bitmap and pageheader 
  // contents
  PF_PageHandle ph;
  if((rc = pfh.GetThisPage(page, ph))){
    return (rc);
  }
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    goto cleanup_and_exit;

  // Check if there really exists a record here according to the header
  bool recordExists;
  if ((rc = CheckBitSet(bitmap, header.numRecordsPerPage, slot, recordExists)))
    goto cleanup_and_exit;
  if(!recordExists){
    rc = RM_INVALIDRECORD;
    goto cleanup_and_exit;
  }

  // Set the record and return it
  if((rc = rec.SetRecord(rid, bitmap + (header.bitmapSize) + slot*(header.recordSize), 
    header.recordSize)))
    goto cleanup_and_exit;

  // always unpin the page before returning
  cleanup_and_exit:
  RC rc2;
  if((rc2 = pfh.UnpinPage(page)))
    return (rc2);
  return (rc); 
}